

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O0

void test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *m1,SquareMatrix<std::complex<double>_> *m2)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  complex<double> *pcVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  int i;
  int j;
  R tol;
  R eps;
  SquareMatrix<std::complex<double>_> *m2_local;
  SquareMatrix<std::complex<double>_> *m1_local;
  
  iVar2 = qclab::dense::SquareMatrix<std::complex<double>_>::rows(m1);
  iVar3 = qclab::dense::SquareMatrix<std::complex<double>_>::rows(m2);
  if (iVar2 != iVar3) {
    __assert_fail("m1.rows() == m2.rows()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                  ,0x1a,
                  "void test_qclab_qgates_iSWAP_check(const M, const M) [M = qclab::dense::SquareMatrix<std::complex<double>>]"
                 );
  }
  iVar2 = qclab::dense::SquareMatrix<std::complex<double>_>::cols(m1);
  iVar3 = qclab::dense::SquareMatrix<std::complex<double>_>::cols(m2);
  if (iVar2 != iVar3) {
    __assert_fail("m1.cols() == m2.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                  ,0x1b,
                  "void test_qclab_qgates_iSWAP_check(const M, const M) [M = qclab::dense::SquareMatrix<std::complex<double>>]"
                 );
  }
  std::numeric_limits<double>::epsilon();
  for (gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      lVar4 = (long)gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_,
      iVar2 = qclab::dense::SquareMatrix<std::complex<double>_>::cols(m1), lVar4 < iVar2;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    for (gtest_ar.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._0_4_ = 0;
        lVar4 = (long)(int)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,
        iVar2 = qclab::dense::SquareMatrix<std::complex<double>_>::rows(m1), lVar4 < iVar2;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             (int)gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 1) {
      pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                         (m1,(long)(int)gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,
                          (long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
      dVar7 = std::real<double>(pcVar5);
      pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                         (m2,(long)(int)gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,
                          (long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
      dVar8 = std::real<double>(pcVar5);
      testing::internal::DoubleNearPredFormat
                ((internal *)local_40,"std::real( m1(i,j) )","std::real( m2(i,j) )","tol",dVar7,
                 dVar8,2.220446049250313e-14);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
      if (!bVar1) {
        testing::Message::Message(&local_48);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                   ,0x23,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_48);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
      pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                         (m1,(long)(int)gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,
                          (long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
      dVar7 = std::imag<double>(pcVar5);
      pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                         (m2,(long)(int)gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,
                          (long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
      dVar8 = std::imag<double>(pcVar5);
      testing::internal::DoubleNearPredFormat
                ((internal *)local_70,"std::imag( m1(i,j) )","std::imag( m2(i,j) )","tol",dVar7,
                 dVar8,2.220446049250313e-14);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
      if (!bVar1) {
        testing::Message::Message(&local_78);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                   ,0x24,pcVar6);
        testing::internal::AssertHelper::operator=(&local_80,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        testing::Message::~Message(&local_78);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    }
  }
  return;
}

Assistant:

void test_qclab_qgates_iSWAP_check( const M m1 , const M m2 ) {

  assert( m1.rows() == m2.rows() ) ;
  assert( m1.cols() == m2.cols() ) ;

  using R = qclab::real_t< typename M::value_type > ;
  const R eps = std::numeric_limits< R >::epsilon() ;
  const R tol = 100 * eps ;

  for ( int j = 0; j < m1.cols(); j++ ) {
    for ( int i = 0; i < m1.rows(); i++ ) {
      EXPECT_NEAR( std::real( m1(i,j) ) , std::real( m2(i,j) ) , tol ) ;
      EXPECT_NEAR( std::imag( m1(i,j) ) , std::imag( m2(i,j) ) , tol ) ;
    }
  }

}